

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

void Assimp::SceneCombiner::Copy(aiNodeAnim **_dest,aiNodeAnim *src)

{
  aiNodeAnim *this;
  aiNodeAnim *dest;
  aiNodeAnim *src_local;
  aiNodeAnim **_dest_local;
  
  if ((_dest != (aiNodeAnim **)0x0) && (src != (aiNodeAnim *)0x0)) {
    this = (aiNodeAnim *)operator_new(0x438);
    aiNodeAnim::aiNodeAnim(this);
    *_dest = this;
    memcpy(this,src,0x438);
    GetArrayCopy<aiVectorKey>(&this->mPositionKeys,this->mNumPositionKeys);
    GetArrayCopy<aiVectorKey>(&this->mScalingKeys,this->mNumScalingKeys);
    GetArrayCopy<aiQuatKey>(&this->mRotationKeys,this->mNumRotationKeys);
  }
  return;
}

Assistant:

void SceneCombiner::Copy(aiNodeAnim** _dest, const aiNodeAnim* src) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    aiNodeAnim* dest = *_dest = new aiNodeAnim();

    // get a flat copy
    ::memcpy(dest,src,sizeof(aiNodeAnim));

    // and reallocate all arrays
    GetArrayCopy( dest->mPositionKeys, dest->mNumPositionKeys );
    GetArrayCopy( dest->mScalingKeys,  dest->mNumScalingKeys );
    GetArrayCopy( dest->mRotationKeys, dest->mNumRotationKeys );
}